

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int coda_cursor_read_int16(coda_cursor *cursor,int16_t *dst)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  uint8_t value_1;
  int8_t value;
  coda_native_type read_type;
  byte local_1e;
  char local_1d;
  coda_native_type local_1c;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n - 1].type == (coda_dynamic_type_struct *)0x0)) {
    pcVar3 = "invalid cursor argument (%s:%u)";
    uVar4 = 0x74d;
  }
  else {
    if (dst != (int16_t *)0x0) {
      get_read_type(cursor,&local_1c);
      if (local_1c == coda_native_type_int16) {
        iVar2 = read_int16(cursor,dst);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else {
        if (local_1c == coda_native_type_uint8) {
          iVar2 = read_uint8(cursor,&local_1e);
          if (iVar2 != 0) {
            return -1;
          }
          uVar1 = (ushort)local_1e;
        }
        else {
          if (local_1c != coda_native_type_int8) {
            pcVar3 = coda_type_get_native_type_name(local_1c);
            coda_set_error(-0x69,"can not read %s data using a int16 data type",pcVar3);
            return -1;
          }
          iVar2 = read_int8(cursor,&local_1d);
          if (iVar2 != 0) {
            return -1;
          }
          uVar1 = (ushort)local_1d;
        }
        *dst = uVar1;
      }
      return 0;
    }
    pcVar3 = "dst argument is NULL (%s:%u)";
    uVar4 = 0x752;
  }
  coda_set_error(-100,pcVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_int16(const coda_cursor *cursor, int16_t *dst)
{
    coda_native_type read_type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (get_read_type(cursor, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            {
                int8_t value;

                if (read_int8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (int16_t)value;
            }
            break;
        case coda_native_type_uint8:
            {
                uint8_t value;

                if (read_uint8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (int16_t)value;
            }
            break;
        case coda_native_type_int16:
            if (read_int16(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a int16 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}